

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SignedConversionFunction::~SignedConversionFunction
          (SignedConversionFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~SignedConversionFunction((SignedConversionFunction *)0xac6d18);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SignedConversionFunction(KnownSystemName knownNameId, bool toSigned) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), toSigned(toSigned) {}